

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O1

bool __thiscall
chatra::Thread::checkDebugBreak<chatra::Thread::stepRun()::__3>
          (Thread *this,Node *node0,Thread *thread,ulong *phase)

{
  ulong uVar1;
  
  uVar1 = *phase;
  if (((uVar1 & 0x7fffffffffffffff) < 0x7ffffffffffffffd) && (-1 < (long)uVar1)) {
    *phase = uVar1 + 0x8000000000000000;
    RuntimeImp::debugBreak(this->runtime,node0,thread);
    return true;
  }
  *phase = uVar1 & 0x7fffffffffffffff;
  return false;
}

Assistant:

bool Thread::checkDebugBreak(Node* node0, Thread* thread, size_t& phase, PhaseCond phaseCond) {
	if (!phaseCond(phase & Phase::PhaseMask)) {
		phase &= Phase::PhaseMask;
		return false;
	}

	if ((phase & Phase::BreakPointFlag) == 0) {
		phase |= Phase::BreakPointFlag;
		runtime.debugBreak(node0, thread);
		return true;
	}

	phase &= Phase::PhaseMask;
	return false;
}